

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.hpp
# Opt level: O1

void __thiscall inja::Renderer::throw_renderer_error(Renderer *this,string *message,AstNode *node)

{
  pointer pcVar1;
  void *pvVar2;
  RenderError *this_00;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  SourceLocation location;
  
  pcVar1 = (this->current_template->content)._M_dataplus._M_p;
  uVar5 = (this->current_template->content)._M_string_length;
  if (node->pos < uVar5) {
    uVar5 = node->pos;
  }
  uVar3 = uVar5;
  if (uVar5 == 0) {
LAB_0011feee:
    uVar4 = 0xffffffffffffffff;
  }
  else {
    do {
      uVar4 = uVar3 - 1;
      if (uVar3 == 0) goto LAB_0011feee;
      lVar8 = uVar3 - 1;
      uVar3 = uVar4;
    } while (pcVar1[lVar8] != '\n');
  }
  if (uVar4 == 0xffffffffffffffff) {
    sVar6 = uVar5 + 1;
    sVar7 = 1;
  }
  else {
    uVar3 = 0;
    lVar8 = 0;
    do {
      if (uVar5 < uVar3 || uVar5 - uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        pvVar2 = memchr(pcVar1 + uVar3,10,uVar5 - uVar3);
        uVar3 = (long)pvVar2 + (1 - (long)pcVar1);
        if (pvVar2 == (void *)0x0) {
          uVar3 = 0;
        }
      }
    } while ((uVar3 != 0) && (lVar8 = lVar8 + 1, uVar3 <= uVar5));
    sVar7 = lVar8 + 1;
    sVar6 = uVar5 - uVar4;
  }
  this_00 = (RenderError *)__cxa_allocate_exception(0x60);
  location.column = sVar6;
  location.line = sVar7;
  RenderError::RenderError(this_00,message,location);
  __cxa_throw(this_00,&RenderError::typeinfo,InjaError::~InjaError);
}

Assistant:

void throw_renderer_error(const std::string& message, const AstNode& node) {
    const SourceLocation loc = get_source_location(current_template->content, node.pos);
    INJA_THROW(RenderError(message, loc));
  }